

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O0

void __thiscall
cmGlobVerificationManager::AddCacheEntry
          (cmGlobVerificationManager *this,cmGlobCacheEntry *entry,string *variable,
          cmListFileBacktrace *backtrace,cmMessenger *messenger)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  type *ptVar7;
  type *bt_00;
  string local_288;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  *local_268;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  *bt;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
  *__range3;
  ostringstream message;
  CacheEntryValue *value;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  CacheEntryKey key;
  cmMessenger *messenger_local;
  cmListFileBacktrace *backtrace_local;
  string *variable_local;
  cmGlobCacheEntry *entry_local;
  cmGlobVerificationManager *this_local;
  
  bVar4 = entry->Recurse;
  bVar1 = entry->ListDirectories;
  bVar2 = entry->FollowSymlinks;
  key.Expression.field_2._8_8_ = messenger;
  std::__cxx11::string::string((string *)&local_98,(string *)&entry->Relative);
  std::__cxx11::string::string((string *)&local_b8,(string *)&entry->Expression);
  CacheEntryKey::CacheEntryKey
            ((CacheEntryKey *)local_78,(bool)(bVar4 & 1),(bool)(bVar1 & 1),(bool)(bVar2 & 1),
             &local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  pmVar5 = std::
           map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
           ::operator[](&this->Cache,(key_type *)local_78);
  if ((pmVar5->Initialized & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar5->Files,&entry->Files);
    pmVar5->Initialized = true;
    std::
    vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
    ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
              ((vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
                *)&pmVar5->Backtraces,variable,backtrace);
  }
  else if (((pmVar5->Initialized & 1U) == 0) ||
          (bVar4 = std::operator!=(&pmVar5->Files,&entry->Files), !bVar4)) {
    std::
    vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
    ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
              ((vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
                *)&pmVar5->Backtraces,variable,backtrace);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range3);
    std::ostream::operator<<(&__range3,std::boolalpha);
    std::operator<<((ostream *)&__range3,"The glob expression\n ");
    CacheEntryKey::PrintGlobCommand((CacheEntryKey *)local_78,(ostream *)&__range3,variable);
    std::operator<<((ostream *)&__range3,
                    "\nwas already present in the glob cache but the directory contents have changed during the configuration run.\n"
                   );
    std::operator<<((ostream *)&__range3,"Matching glob expressions:");
    __end3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
             ::begin(&pmVar5->Backtraces);
    bt = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
            ::end(&pmVar5->Backtraces);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
                                       *)&bt), uVar3 = key.Expression.field_2._8_8_, bVar4) {
      local_268 = __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
                  ::operator*(&__end3);
      poVar6 = std::operator<<((ostream *)&__range3,"\n  ");
      ptVar7 = std::get<0ul,std::__cxx11::string,cmListFileBacktrace>(local_268);
      std::operator<<(poVar6,(string *)ptVar7);
      uVar3 = key.Expression.field_2._8_8_;
      bt_00 = std::get<1ul,std::__cxx11::string,cmListFileBacktrace>(local_268);
      cmMessenger::PrintBacktraceTitle((cmMessenger *)uVar3,(ostream *)&__range3,bt_00);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
      ::operator++(&__end3);
    }
    std::__cxx11::ostringstream::str();
    cmMessenger::IssueMessage((cmMessenger *)uVar3,FATAL_ERROR,&local_288,backtrace);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range3);
  }
  CacheEntryKey::~CacheEntryKey((CacheEntryKey *)local_78);
  return;
}

Assistant:

void cmGlobVerificationManager::AddCacheEntry(
  const cmGlobCacheEntry& entry, const std::string& variable,
  const cmListFileBacktrace& backtrace, cmMessenger* messenger)
{
  CacheEntryKey key =
    CacheEntryKey(entry.Recurse, entry.ListDirectories, entry.FollowSymlinks,
                  entry.Relative, entry.Expression);
  CacheEntryValue& value = this->Cache[key];
  if (!value.Initialized) {
    value.Files = entry.Files;
    value.Initialized = true;
    value.Backtraces.emplace_back(variable, backtrace);
  } else if (value.Initialized && value.Files != entry.Files) {
    std::ostringstream message;
    message << std::boolalpha;
    message << "The glob expression\n ";
    key.PrintGlobCommand(message, variable);
    message << "\nwas already present in the glob cache but the directory "
               "contents have changed during the configuration run.\n";
    message << "Matching glob expressions:";
    for (auto const& bt : value.Backtraces) {
      message << "\n  " << std::get<0>(bt);
      messenger->PrintBacktraceTitle(message, std::get<1>(bt));
    }
    messenger->IssueMessage(MessageType::FATAL_ERROR, message.str(),
                            backtrace);
  } else {
    value.Backtraces.emplace_back(variable, backtrace);
  }
}